

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O2

int blake2sp_final(blake2sp_state *S,void *out,size_t outlen)

{
  int iVar1;
  ulong inlen;
  long lVar2;
  long lVar3;
  blake2s_state *S_00;
  ulong uVar4;
  uint8_t (*out_00) [32];
  uint8_t hash [8] [32];
  
  iVar1 = -1;
  if ((out != (void *)0x0) && (S->outlen <= outlen)) {
    lVar2 = -0x440;
    out_00 = hash;
    lVar3 = 0;
    for (uVar4 = 0; uVar4 != 0x200; uVar4 = uVar4 + 0x40) {
      S_00 = (blake2s_state *)((long)S->R[0].h + lVar2);
      if (uVar4 < S->buflen) {
        inlen = S->buflen + lVar3;
        if (0x3f < inlen) {
          inlen = 0x40;
        }
        blake2s_update(S_00,S->buf + uVar4,inlen);
      }
      blake2s_final(S_00,out_00,0x20);
      lVar3 = lVar3 + -0x40;
      lVar2 = lVar2 + 0x88;
      out_00 = out_00 + 1;
    }
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 0x20) {
      blake2s_update(S->R,hash[0] + lVar2,0x20);
    }
    iVar1 = blake2s_final(S->R,out,S->outlen);
  }
  return iVar1;
}

Assistant:

int blake2sp_final( blake2sp_state *S, void *out, size_t outlen )
{
  uint8_t hash[PARALLELISM_DEGREE][BLAKE2S_OUTBYTES];
  size_t i;

  if(out == NULL || outlen < S->outlen) {
    return -1;
  }

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
  {
    if( S->buflen > i * BLAKE2S_BLOCKBYTES )
    {
      size_t left = S->buflen - i * BLAKE2S_BLOCKBYTES;

      if( left > BLAKE2S_BLOCKBYTES ) left = BLAKE2S_BLOCKBYTES;

      blake2s_update( S->S[i], S->buf + i * BLAKE2S_BLOCKBYTES, left );
    }

    blake2s_final( S->S[i], hash[i], BLAKE2S_OUTBYTES );
  }

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    blake2s_update( S->R, hash[i], BLAKE2S_OUTBYTES );

  return blake2s_final( S->R, out, S->outlen );
}